

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

void Gia_ManPrintBarBufDrivers(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  bool bVar3;
  uint local_48 [2];
  int CountFans [2];
  int CountCrit [2];
  int iFanin;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCrits;
  Vec_Int_t *vFan;
  Vec_Int_t *vMap;
  Gia_Man_t *p_local;
  
  memset(CountFans,0,8);
  memset(local_48,0,8);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStart(iVar1);
  p_02 = Vec_IntAlloc(100);
  CountCrit[1] = 0;
  while( true ) {
    bVar3 = false;
    if (CountCrit[1] < p->nObjs) {
      _iFanin = Gia_ManObj(p,CountCrit[1]);
      bVar3 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsBuf(_iFanin);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsCo(_iFanin), iVar1 == 0)) {
      iVar1 = Gia_ObjIsAnd(_iFanin);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId0(_iFanin,CountCrit[1]);
        Vec_IntAddToEntry(p_01,iVar1,1);
        iVar1 = Gia_ObjFaninId1(_iFanin,CountCrit[1]);
        Vec_IntAddToEntry(p_01,iVar1,1);
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0(_iFanin,CountCrit[1]);
      Vec_IntAddToEntry(p_01,iVar1,1);
    }
    iVar1 = Gia_ObjIsBuf(_iFanin);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(_iFanin,CountCrit[1]);
      if ((iVar1 == 0) || (iVar2 = Vec_IntEntry(p_00,iVar1), iVar2 != 0)) {
        CountFans[(int)(uint)(iVar1 != 0)] = CountFans[(int)(uint)(iVar1 != 0)] + 1;
        Vec_IntPush(p_02,CountCrit[1]);
      }
      else {
        iVar2 = Gia_ObjFaninC0(_iFanin);
        iVar2 = Abc_Var2Lit(CountCrit[1],iVar2);
        Vec_IntWriteEntry(p_00,iVar1,iVar2);
      }
    }
    CountCrit[1] = CountCrit[1] + 1;
  }
  CountCrit[1] = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_02);
    bVar3 = false;
    if (CountCrit[1] < iVar1) {
      iVar1 = Vec_IntEntry(p_02,CountCrit[1]);
      _iFanin = Gia_ManObj(p,iVar1);
      bVar3 = _iFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsBuf(_iFanin);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                    ,0xf8,"void Gia_ManPrintBarBufDrivers(Gia_Man_t *)");
    }
    iVar1 = Vec_IntEntry(p_01,CountCrit[1]);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0p(p,_iFanin);
      local_48[(int)(uint)(iVar1 != 0)] = local_48[(int)(uint)(iVar1 != 0)] + 1;
    }
    CountCrit[1] = CountCrit[1] + 1;
  }
  printf("Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n",
         (ulong)local_48[0],(ulong)(uint)CountFans[0],(ulong)local_48[1],(ulong)(uint)CountFans[1]);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return;
}

Assistant:

void Gia_ManPrintBarBufDrivers( Gia_Man_t * p )
{
    Vec_Int_t * vMap, * vFan, * vCrits;
    Gia_Obj_t * pObj;
    int i, iFanin, CountCrit[2] = {0}, CountFans[2] = {0};
    // map barbuf drivers into barbuf literals of the first barbuf driven by them
    vMap = Vec_IntStart( Gia_ManObjNum(p) );
    vFan = Vec_IntStart( Gia_ManObjNum(p) );
    vCrits = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        // count fanouts
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjIsCo(pObj) )
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId1(pObj, i), 1 );
        }
        // count critical barbufs
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0( pObj, i );
            if ( iFanin == 0 || Vec_IntEntry(vMap, iFanin) != 0 )
            {
                CountCrit[(int)(iFanin != 0)]++;
                Vec_IntPush( vCrits, i );
                continue;
            }
            Vec_IntWriteEntry( vMap, iFanin, Abc_Var2Lit(i, Gia_ObjFaninC0(pObj)) );
        }
    }
    // check fanouts of the critical barbufs
    Gia_ManForEachObjVec( vCrits, p, pObj, i )
    {
        assert( Gia_ObjIsBuf(pObj) );
        if ( Vec_IntEntry(vFan, i) == 0 )
            continue;
        iFanin = Gia_ObjFaninId0p( p, pObj );
        CountFans[(int)(iFanin != 0)]++;
    }
    printf( "Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n", 
        CountFans[0], CountCrit[0], CountFans[1], CountCrit[1] );
    Vec_IntFree( vMap );
    Vec_IntFree( vFan );
    Vec_IntFree( vCrits );
}